

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void __thiscall
tokenized_prompt::padding_seq
          (tokenized_prompt *this,llama_context *ctx,vector<int,_std::allocator<int>_> *tokens,
          size_t len)

{
  vector<int,_std::allocator<int>_> pad_tokens;
  llama_token pad_tok;
  allocator<char> local_51;
  _Vector_base<int,_std::allocator<int>_> local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38," ",&local_51);
  common_tokenize((vector<int,_std::allocator<int>_> *)&local_50,ctx,&local_38,false,false);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = local_50._M_impl.super__Vector_impl_data._M_finish[-1];
  while ((ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2) < len) {
    std::vector<int,_std::allocator<int>_>::push_back(tokens,(value_type_conflict2 *)&local_38);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void padding_seq(llama_context * ctx, std::vector<llama_token> & tokens, size_t len) {
        // TODO: customize padding token
        std::vector<llama_token> pad_tokens = common_tokenize(ctx, " ", false);
        llama_token pad_tok = pad_tokens.back();
        while (tokens.size() < len) {
            tokens.push_back(pad_tok);
        }
    }